

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeyore_dump.cpp
# Opt level: O3

ostream * operator<<(ostream *out,ee_expr_op *op)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  size_t sVar6;
  ee_rval *peVar7;
  char *pcVar8;
  overloaded<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gzz2000[P]Compiler101_eeyore_dump_cpp:34:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gzz2000[P]Compiler101_eeyore_dump_cpp:35:7)>
  local_38;
  
  local_38.super_anon_class_8_1_ba1d6aae.out = out;
  if (op->numop == 1) {
    iVar3 = op->op;
    std::__ostream_insert<char,std::char_traits<char>>(out,"  ",2);
    cVar1 = (op->sym).type;
    if (iVar3 == 0x10e) {
      local_38.super_anon_class_8_1_ba1d6aae.out._0_1_ = cVar1;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_38,1);
      std::ostream::operator<<((ostream *)poVar5,(op->sym).id);
      std::__ostream_insert<char,std::char_traits<char>>(out," = ",3);
      bVar2 = *(__index_type *)
               ((long)&(op->b).super__Variant_base<int,_ee_symbol>.
                       super__Move_assign_alias<int,_ee_symbol>.
                       super__Copy_assign_alias<int,_ee_symbol>.
                       super__Move_ctor_alias<int,_ee_symbol>.super__Copy_ctor_alias<int,_ee_symbol>
                       .super__Variant_storage_alias<int,_ee_symbol> + 8);
      peVar7 = &op->b;
    }
    else {
      local_38.super_anon_class_8_1_ba1d6aae.out._0_1_ = cVar1;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_38,1);
      std::ostream::operator<<((ostream *)poVar5,(op->sym).id);
      std::__ostream_insert<char,std::char_traits<char>>(out," = ",3);
      uVar4 = op->op - 0x10e;
      if (uVar4 < 0xe) {
        pcVar8 = *(char **)(&DAT_00136648 + (ulong)uVar4 * 8);
      }
      else {
        pcVar8 = "???";
      }
      sVar6 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar8,sVar6);
      bVar2 = *(__index_type *)
               ((long)&(op->a).super__Variant_base<int,_ee_symbol>.
                       super__Move_assign_alias<int,_ee_symbol>.
                       super__Copy_assign_alias<int,_ee_symbol>.
                       super__Move_ctor_alias<int,_ee_symbol>.super__Copy_ctor_alias<int,_ee_symbol>
                       .super__Variant_storage_alias<int,_ee_symbol> + 8);
      peVar7 = &op->a;
    }
    local_38.super_anon_class_8_1_ba1d6aae.out = out;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_overloaded<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gzz2000[P]Compiler101/eeyore_dump.cpp:34:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gzz2000[P]Compiler101/eeyore_dump.cpp:35:7)>_&&,_const_std::variant<int,_ee_symbol>_&>
      ::_S_vtable._M_arr[bVar2]._M_data)(&local_38,peVar7);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out,"  ",2);
    local_38.super_anon_class_8_1_ba1d6aae.out._0_1_ = (op->sym).type;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_38,1);
    std::ostream::operator<<((ostream *)poVar5,(op->sym).id);
    std::__ostream_insert<char,std::char_traits<char>>(out," = ",3);
    local_38.super_anon_class_8_1_ba1d6aae.out = out;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_overloaded<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gzz2000[P]Compiler101/eeyore_dump.cpp:34:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gzz2000[P]Compiler101/eeyore_dump.cpp:35:7)>_&&,_const_std::variant<int,_ee_symbol>_&>
      ::_S_vtable._M_arr
      [*(__index_type *)
        ((long)&(op->a).super__Variant_base<int,_ee_symbol>.super__Move_assign_alias<int,_ee_symbol>
                .super__Copy_assign_alias<int,_ee_symbol>.super__Move_ctor_alias<int,_ee_symbol>.
                super__Copy_ctor_alias<int,_ee_symbol>.super__Variant_storage_alias<int,_ee_symbol>
        + 8)]._M_data)(&local_38,&op->a);
    std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
    uVar4 = op->op - 0x10e;
    if (uVar4 < 0xe) {
      pcVar8 = *(char **)(&DAT_00136648 + (ulong)uVar4 * 8);
    }
    else {
      pcVar8 = "???";
    }
    sVar6 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar8,sVar6);
    std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
    local_38.super_anon_class_8_1_ba1d6aae.out = out;
    local_38.super_anon_class_8_1_ba1d6aae.out = out;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_overloaded<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gzz2000[P]Compiler101/eeyore_dump.cpp:34:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gzz2000[P]Compiler101/eeyore_dump.cpp:35:7)>_&&,_const_std::variant<int,_ee_symbol>_&>
      ::_S_vtable._M_arr
      [*(__index_type *)
        ((long)&(op->b).super__Variant_base<int,_ee_symbol>.super__Move_assign_alias<int,_ee_symbol>
                .super__Copy_assign_alias<int,_ee_symbol>.super__Move_ctor_alias<int,_ee_symbol>.
                super__Copy_ctor_alias<int,_ee_symbol>.super__Variant_storage_alias<int,_ee_symbol>
        + 8)]._M_data)(&local_38,&op->b);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return out;
}

Assistant:

DEFOUT(const ee_expr_op &op) {
  if(op.numop == 1) {
    if(op.op == OP_ADD) out << "  " << op.sym << " = " << op.b << endl;
    else out << "  " << op.sym << " = " << opname2str(op.op) << op.a << endl;
  }
  else {
    out << "  " << op.sym << " = " << op.a << " " << opname2str(op.op) << " " << op.b << endl;
  }
  return out;
}